

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O1

DictionaryFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_dictionarytype(FeatureType *this)

{
  ulong uVar1;
  DictionaryFeatureType *pDVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 6) {
    clear_Type(this);
    this->_oneof_case_[0] = 6;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pDVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::DictionaryFeatureType>(arena);
    (this->Type_).dictionarytype_ = pDVar2;
  }
  return (DictionaryFeatureType *)(this->Type_).int64type_;
}

Assistant:

inline ::CoreML::Specification::DictionaryFeatureType* FeatureType::mutable_dictionarytype() {
  ::CoreML::Specification::DictionaryFeatureType* _msg = _internal_mutable_dictionarytype();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.dictionaryType)
  return _msg;
}